

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_hdr_scanline
               (stbi__write_context *s,int width,int ncomp,uchar *scratch,float *scanline)

{
  int iVar1;
  long lVar2;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_R8;
  int len_1;
  int len;
  uchar *comp;
  int r;
  int c;
  int x;
  float linear [3];
  uchar rgbe [4];
  uchar scanlineheader [4];
  uchar in_stack_ffffffffffffffab;
  uint in_stack_ffffffffffffffac;
  uint uVar3;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined2 local_24;
  undefined1 uStack_22;
  undefined1 uStack_21;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  _local_24 = CONCAT13((char)in_ESI,CONCAT12((char)((uint)in_ESI >> 8),0x202));
  local_20 = in_R8;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((in_ESI < 8) || (0x7fff < in_ESI)) {
    for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
      if (local_10 == 3 || local_10 == 4) {
        uVar6 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10) * 4);
        uVar7 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10 + 1) * 4);
        uVar8 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10 + 2) * 4);
      }
      else {
        uVar6 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10) * 4);
        uVar7 = uVar6;
        uVar8 = uVar6;
      }
      stbiw__linear_to_rgbe((uchar *)CONCAT44(uVar8,uVar7),(float *)CONCAT44(uVar6,iVar4));
      (*(code *)*local_8)(local_8[1],&local_28,4);
    }
  }
  else {
    local_18 = in_RCX;
    for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
      if (local_10 == 3 || local_10 == 4) {
        uVar6 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10) * 4);
        uVar7 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10 + 1) * 4);
        uVar8 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10 + 2) * 4);
      }
      else {
        uVar6 = *(undefined4 *)(local_20 + (long)(iVar4 * local_10) * 4);
        uVar7 = uVar6;
        uVar8 = uVar6;
      }
      stbiw__linear_to_rgbe((uchar *)CONCAT44(uVar8,uVar7),(float *)CONCAT44(uVar6,iVar4));
      *(undefined1 *)(local_18 + iVar4) = local_28;
      *(undefined1 *)(local_18 + (iVar4 + local_c)) = local_27;
      *(undefined1 *)(local_18 + (iVar4 + local_c * 2)) = local_26;
      *(undefined1 *)(local_18 + (iVar4 + local_c * 3)) = local_25;
    }
    (*(code *)*local_8)(local_8[1],&local_24,4);
    for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
      lVar2 = local_18 + local_c * iVar4;
      iVar5 = 0;
      while (iVar1 = iVar5, iVar5 < local_c) {
        for (; (iVar1 + 2 < local_c &&
               ((*(char *)(lVar2 + iVar1) != *(char *)(lVar2 + (iVar1 + 1)) ||
                (*(char *)(lVar2 + iVar1) != *(char *)(lVar2 + (iVar1 + 2)))))); iVar1 = iVar1 + 1)
        {
        }
        uVar3 = in_stack_ffffffffffffffac;
        if (local_c <= iVar1 + 2) {
          iVar1 = local_c;
        }
        for (; iVar5 < iVar1; iVar5 = in_stack_ffffffffffffffb4 + iVar5) {
          in_stack_ffffffffffffffb4 = iVar1 - iVar5;
          if (0x80 < in_stack_ffffffffffffffb4) {
            in_stack_ffffffffffffffb4 = 0x80;
          }
          stbiw__write_dump_data
                    ((stbi__write_context *)CONCAT44(iVar4,iVar1),(int)((ulong)lVar2 >> 0x20),
                     (uchar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
        in_stack_ffffffffffffffac = uVar3;
        if (iVar1 + 2 < local_c) {
          while( true ) {
            in_stack_ffffffffffffffac = uVar3 & 0xffffff;
            if (iVar1 < local_c) {
              in_stack_ffffffffffffffac =
                   CONCAT13(*(char *)(lVar2 + iVar1) == *(char *)(lVar2 + iVar5),(int3)uVar3);
            }
            if ((char)(in_stack_ffffffffffffffac >> 0x18) == '\0') break;
            iVar1 = iVar1 + 1;
            uVar3 = in_stack_ffffffffffffffac;
          }
          for (; iVar5 < iVar1; iVar5 = in_stack_ffffffffffffffb0 + iVar5) {
            in_stack_ffffffffffffffb0 = iVar1 - iVar5;
            if (0x7f < in_stack_ffffffffffffffb0) {
              in_stack_ffffffffffffffb0 = 0x7f;
            }
            stbiw__write_run_data
                      ((stbi__write_context *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffab);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(stbi__write_context *s, int width, int ncomp, unsigned char *scratch, float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         s->func(s->context, rgbe, 4);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      s->func(s->context, scanlineheader, 4);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(s, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(s, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}